

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O2

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmTextureCalc::GetMipMapByteAddress
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_RESOURCE_TYPE GVar1;
  uint uVar2;
  uint8_t uVar3;
  GMM_PLATFORM_INFO *pGVar4;
  ulong uVar5;
  GMM_GFX_SIZE_T GVar6;
  ulong uVar7;
  long lVar8;
  GMM_GFX_SIZE_T GVar9;
  
  if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0 || pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    return 1;
  }
  uVar7 = (ulong)pReqInfo->MipLevel;
  GVar6 = pTexInfo->Pitch;
  GVar9 = *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + (ulong)(*(uint *)pReqInfo & 1) * 8 + 0x70);
  pGVar4 = GmmGetPlatformInfo(this->pGmmLibContext);
  if ((pTexInfo->Type == RESOURCE_3D) && (((pTexInfo->Flags).Info.field_0x2 & 8) == 0)) {
    GVar9 = GVar9 * pGVar4->TileInfo[pTexInfo->TileMode].LogicalTileDepth;
  }
  if ((((10 < (int)(pGVar4->Platform).eRenderCoreFamily) &&
       (uVar5 = (ulong)(pTexInfo->MSAA).NumSamples, 1 < uVar5)) &&
      (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0)) &&
     ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) == 0)) {
    GVar9 = GVar9 * uVar5;
  }
  uVar3 = GmmIsPlanar(pTexInfo->Format);
  if (uVar3 == '\0') {
    GVar1 = pTexInfo->Type;
    if (GVar1 - RESOURCE_1D < 2) {
      GVar6 = *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + uVar7 * 8 + 0x80);
      uVar2 = pReqInfo->ArrayIndex;
LAB_001bb309:
      if ((ulong)uVar2 != 0) {
        GVar6 = GVar6 + GVar9 * uVar2;
      }
    }
    else if (GVar1 == RESOURCE_3D) {
      if (0xb < (int)(pGVar4->Platform).eRenderCoreFamily) {
        GVar6 = *(GMM_GFX_SIZE_T *)(pTexInfo->MmcHint + uVar7 * 8 + 0x80);
        uVar2 = pReqInfo->Slice;
        goto LAB_001bb309;
      }
      GVar6 = Get3DMipByteAddress(this,pTexInfo,pReqInfo);
    }
    else if (GVar1 == RESOURCE_CUBE) {
      GVar6 = GVar9 * (pReqInfo->ArrayIndex * 6 + pReqInfo->CubeFace) +
              *(long *)(pTexInfo->MmcHint + uVar7 * 8 + 0x80);
    }
    else {
      GVar6 = 0;
    }
  }
  else {
    uVar7 = (ulong)pReqInfo->Plane;
    if (uVar7 < 4) {
      uVar5 = (ulong)*(uint *)(pTexInfo->MmcHint + uVar7 * 8 + 0x78);
      uVar7 = (ulong)*(uint *)((long)&(pTexInfo->OffsetInfo).field_0 + uVar7 * 8 + 0x28);
      GVar9 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch;
    }
    else {
      uVar5 = 0;
      uVar7 = 0;
    }
    GVar6 = pReqInfo->ArrayIndex * GVar9 + uVar7 * GVar6 + uVar5;
  }
  if (((pTexInfo->Flags).Gpu.field_0x3 & 1) == 0) {
LAB_001bb2d8:
    uVar7 = 0;
  }
  else {
    if (pReqInfo->Frame == GMM_DISPLAY_R) {
      lVar8 = 0x1c4;
    }
    else {
      if (pReqInfo->Frame != GMM_DISPLAY_BLANK_AREA) goto LAB_001bb2d8;
      lVar8 = 0x1c8;
    }
    uVar7 = (ulong)*(uint *)(pTexInfo->MmcMode + lVar8 + -0x70);
  }
  return uVar7 + GVar6;
}

Assistant:

GMM_GFX_SIZE_T GmmLib::GmmTextureCalc::GetMipMapByteAddress(GMM_TEXTURE_INFO *   pTexInfo,
                                                            GMM_REQ_OFFSET_INFO *pReqInfo)
{
    GMM_GFX_SIZE_T ArrayQPitch, MipMapByteAddress, Pitch;
    uint32_t       MipLevel;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);
    __GMM_ASSERT(!(pTexInfo->Flags.Gpu.CCS && !pTexInfo->Flags.Gpu.UnifiedAuxSurface));
    __GMM_ASSERT(pReqInfo->Plane < GMM_MAX_PLANE);

    MipLevel    = pReqInfo->MipLevel;
    Pitch       = pTexInfo->Pitch;
    ArrayQPitch = pReqInfo->ReqRender ?
                  pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender :
                  pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear)
    {
        ArrayQPitch *= pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth;
    }

    if((GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN8_CORE) &&
       ((pTexInfo->MSAA.NumSamples > 1) &&
        !(pTexInfo->Flags.Gpu.Depth ||
          pTexInfo->Flags.Gpu.SeparateStencil ||
          GMM_IS_64KB_TILE(pTexInfo->Flags) ||
          pTexInfo->Flags.Info.TiledYf)))
    {
        ArrayQPitch *= pTexInfo->MSAA.NumSamples;
    }

    if(GmmIsPlanar(pTexInfo->Format))
    {
        uint32_t Plane = pReqInfo->Plane;

        uint32_t OffsetX = 0;
        uint32_t OffsetY = 0;
        if(Plane < GMM_MAX_PLANE)
        {
            OffsetX     = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.X[Plane]);
            OffsetY     = GFX_ULONG_CAST(pTexInfo->OffsetInfo.Plane.Y[Plane]);
            ArrayQPitch = pTexInfo->OffsetInfo.Plane.ArrayQPitch;
	}
        MipMapByteAddress = (OffsetY * Pitch) + OffsetX;

        __GMM_ASSERT(!pReqInfo->ArrayIndex || (pReqInfo->ArrayIndex < pTexInfo->ArraySize));

        MipMapByteAddress += (ArrayQPitch * pReqInfo->ArrayIndex);
    }
    else
    {
        switch(pTexInfo->Type)
        {
            case RESOURCE_CUBE:
            {
                uint32_t CubeFace = pReqInfo->CubeFace;

                GMM_ASSERTDPF( // Validate Cube Map Params...
                (!pReqInfo->ArrayIndex || (pReqInfo->ArrayIndex < pTexInfo->ArraySize)) &&
                (pReqInfo->CubeFace < __GMM_MAX_CUBE_FACE) &&
                (pReqInfo->CubeFace != __GMM_NO_CUBE_MAP) &&
                (pReqInfo->Plane == GMM_NO_PLANE) &&
                (pReqInfo->Slice == 0),
                "Invalid parameter!");

                // Support for CubeMap Arrays using 2D Arrays
                MipMapByteAddress = pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[MipLevel];
                MipMapByteAddress += (ArrayQPitch * ((6 * pReqInfo->ArrayIndex) + CubeFace));
                break;
            }
            case RESOURCE_2D:
            case RESOURCE_1D:
            {
                MipMapByteAddress = pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[MipLevel];

                if(pReqInfo->ArrayIndex)
                {
                    MipMapByteAddress += (ArrayQPitch * pReqInfo->ArrayIndex);
                }
                break;
            }
            case RESOURCE_3D:
            {
                if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) >= IGFX_GEN9_CORE)
                {
                    MipMapByteAddress = pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[MipLevel];

                    if(pReqInfo->Slice)
                    {
                        MipMapByteAddress += (ArrayQPitch * pReqInfo->Slice);
                    }
                }
                else
                {
                    MipMapByteAddress = Get3DMipByteAddress(pTexInfo, pReqInfo);
                }
                break;
            }
            default:
            { // These resources don't have multiple levels of detail
                MipMapByteAddress = 0;
                break;
            }
        }
    }

    MipMapByteAddress += pTexInfo->Flags.Gpu.S3d ?
                         GetDisplayFrameOffset(pTexInfo, pReqInfo) :
                         0;

    return MipMapByteAddress;
}